

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O0

ssize_t __thiscall r_comp::Class::write(Class *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  long lVar2;
  size_type sVar3;
  undefined7 extraout_var;
  reference this_00;
  size_t sVar4;
  undefined4 *__n_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  StructureMember *member;
  iterator __end1;
  iterator __begin1;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *__range1;
  uint64_t offset;
  uint32_t *storage_local;
  Class *this_local;
  
  __n_00 = (undefined4 *)CONCAT44(in_register_00000034,__fd);
  *__n_00 = *(undefined4 *)this;
  r_code::WriteString(__n_00 + 1,(string *)&this->str_opcode);
  lVar2 = r_code::GetStringSize((string *)&this->str_opcode);
  __n_00[lVar2 + 1] = this->type;
  __n_00[lVar2 + 2] = this->use_as;
  sVar3 = std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::size
                    (&this->things_to_read);
  __range1 = (vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
             (lVar2 + 4);
  __n_00[lVar2 + 3] = (int)sVar3;
  __end1 = std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::begin
                     (&this->things_to_read);
  member = (StructureMember *)
           std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::end
                     (&this->things_to_read);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<r_comp::StructureMember_*,_std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>_>
                                *)&member);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<r_comp::StructureMember_*,_std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>_>
              ::operator*(&__end1);
    StructureMember::write(this_00,__fd + (int)((long)__range1 << 2),__buf_00,(size_t)__n_00);
    sVar4 = StructureMember::get_size(this_00);
    __range1 = (vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *)
               ((long)&(__range1->
                       super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>
                       )._M_impl.super__Vector_impl_data._M_start + sVar4);
    __gnu_cxx::
    __normal_iterator<r_comp::StructureMember_*,_std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>_>
    ::operator++(&__end1);
  }
  return CONCAT71(extraout_var,bVar1);
}

Assistant:

void Class::write(uint32_t *storage)
{
    storage[0] = atom.atom;
    r_code::WriteString(storage + 1, str_opcode);
    uint64_t offset = 1 + r_code::GetStringSize(str_opcode);
    storage[offset++] = type;
    storage[offset++] = use_as;
    storage[offset++] = things_to_read.size();

    for (StructureMember &member : things_to_read) {
        member.write(storage + offset);
        offset += member.get_size();
    }
}